

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::makeCompositeConstant
          (Builder *this,Id typeId,vector<unsigned_int,_std::allocator<unsigned_int>_> *members,
          bool specConstant)

{
  Op typeClass;
  uint *__last1;
  uint *__first1;
  bool bVar1;
  Id IVar2;
  Instruction *this_00;
  vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_> *this_01;
  undefined7 in_register_00000009;
  uint *__first2;
  uint *puVar3;
  long lVar4;
  size_t numMembers;
  Op opcode;
  size_t op;
  size_t sVar5;
  Instruction *c;
  Id typeId_local;
  ulong local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  __first2 = (uint *)CONCAT71(in_register_00000009,specConstant);
  typeId_local = typeId;
  if (typeId == 0) {
    __assert_fail("typeId",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x765,"Id spv::Builder::makeCompositeConstant(Id, const std::vector<Id> &, bool)"
                 );
  }
  typeClass = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start[typeId]->opCode;
  __last1 = (members->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  __first1 = (members->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  lVar4 = (long)__first1 - (long)__last1;
  puVar3 = __first2;
  if (((typeClass == OpTypeCooperativeVectorNV | this->useReplicatedComposites) & lVar4 != 0) == 1)
  {
    puVar3 = (uint *)((ulong)__first2 & 0xffffffff);
    bVar1 = std::__equal<true>::equal<unsigned_int>
                      ((__equal<true> *)(__last1 + 1),__first1,__last1,__first2);
    if (!bVar1) goto LAB_003d3c2c;
    addCapability(this,CapabilityReplicatedCompositesEXT);
    addExtension(this,"SPV_EXT_replicated_composites");
    numMembers = 1;
    opcode = specConstant + OpConstantCompositeReplicateEXT;
  }
  else {
LAB_003d3c2c:
    numMembers = lVar4 >> 2;
    specConstant = SUB81(puVar3,0);
    opcode = OpConstantComposite;
    if (specConstant != false) {
      opcode = OpSpecConstantComposite;
    }
  }
  if ((typeClass - OpTypeVector < 2) || (typeClass == OpTypeArray)) {
LAB_003d3c71:
    if (specConstant != false) goto LAB_003d3c9d;
    IVar2 = findCompositeConstant(this,typeClass,opcode,typeId,members,numMembers);
  }
  else {
    if (typeClass != OpTypeStruct) {
      if (((typeClass != OpTypeCooperativeMatrixKHR) && (typeClass != OpTypeCooperativeMatrixNV)) &&
         (typeClass != OpTypeCooperativeVectorNV)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0x78f,
                      "Id spv::Builder::makeCompositeConstant(Id, const std::vector<Id> &, bool)");
      }
      goto LAB_003d3c71;
    }
    if (specConstant != false) goto LAB_003d3c9d;
    IVar2 = findStructConstant(this,typeId,members);
  }
  if (IVar2 != 0) {
    return IVar2;
  }
LAB_003d3c9d:
  local_40 = (ulong)typeClass;
  this_00 = (Instruction *)::operator_new(0x60);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00a5fd48;
  this_00->resultId = IVar2;
  this_00->typeId = typeId;
  this_00->opCode = opcode;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_00->block = (Block *)0x0;
  c = this_00;
  Instruction::reserveOperands
            (this_00,(long)(members->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(members->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 2);
  for (sVar5 = 0; numMembers != sVar5; sVar5 = sVar5 + 1) {
    Instruction::addIdOperand
              (this_00,(members->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start[sVar5]);
  }
  local_38._M_head_impl = this_00;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  if ((int)local_40 == 0x1e) {
    this_01 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->groupedStructConstants,&typeId_local);
  }
  else {
    local_38._M_head_impl._0_4_ = (int)local_40;
    this_01 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->groupedConstants,(key_type *)&local_38);
  }
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(this_01,&c);
  Module::mapInstruction(&this->module,c);
  return c->resultId;
}

Assistant:

Id Builder::makeCompositeConstant(Id typeId, const std::vector<Id>& members, bool specConstant)
{
    assert(typeId);
    Op typeClass = getTypeClass(typeId);

    bool replicate = false;
    size_t numMembers = members.size();
    if (useReplicatedComposites || typeClass == OpTypeCooperativeVectorNV) {
        // use replicate if all members are the same
        replicate = numMembers > 0 &&
            std::equal(members.begin() + 1, members.end(), members.begin());

        if (replicate) {
            numMembers = 1;
            addCapability(spv::CapabilityReplicatedCompositesEXT);
            addExtension(spv::E_SPV_EXT_replicated_composites);
        }
    }

    Op opcode = replicate ?
        (specConstant ? OpSpecConstantCompositeReplicateEXT : OpConstantCompositeReplicateEXT) :
        (specConstant ? OpSpecConstantComposite : OpConstantComposite);

    switch (typeClass) {
    case OpTypeVector:
    case OpTypeArray:
    case OpTypeMatrix:
    case OpTypeCooperativeMatrixKHR:
    case OpTypeCooperativeMatrixNV:
    case OpTypeCooperativeVectorNV:
        if (! specConstant) {
            Id existing = findCompositeConstant(typeClass, opcode, typeId, members, numMembers);
            if (existing)
                return existing;
        }
        break;
    case OpTypeStruct:
        if (! specConstant) {
            Id existing = findStructConstant(typeId, members);
            if (existing)
                return existing;
        }
        break;
    default:
        assert(0);
        return makeFloatConstant(0.0);
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->reserveOperands(members.size());
    for (size_t op = 0; op < numMembers; ++op)
        c->addIdOperand(members[op]);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    if (typeClass == OpTypeStruct)
        groupedStructConstants[typeId].push_back(c);
    else
        groupedConstants[typeClass].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}